

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m_joy.cpp
# Opt level: O1

int Joy_XYAxesToButtons(double x,double y)

{
  double dVar1;
  
  if ((x == 0.0) && (!NAN(x))) {
    if ((y == 0.0) && (!NAN(y))) {
      return 0;
    }
  }
  dVar1 = atan2(y,x);
  return (int)"\x01\x05\x04\x06\x02\n\b\t"
              [(int)(((double)(~-(ulong)(dVar1 < 0.0) & (ulong)dVar1 |
                              (ulong)(dVar1 + 6.283185307179586) & -(ulong)(dVar1 < 0.0)) +
                     0.39269908169872414) * 1.2732395447351628) & 7];
}

Assistant:

int Joy_XYAxesToButtons(double x, double y)
{
	if (x == 0 && y == 0)
	{
		return 0;
	}
	double rad = atan2(y, x);
	if (rad < 0)
	{
		rad += 2*M_PI;
	}
	// The circle is divided into eight segments for corresponding
	// button combinations. Each segment is pi/4 radians wide. We offset
	// by half this so that the segments are centered around the ideal lines
	// their buttons represent instead of being right on the lines.
	rad += M_PI/8;		// Offset
	rad *= 4/M_PI;		// Convert range from [0,2pi) to [0,8)
	return JoyAngleButtons[int(rad) & 7];
}